

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::VersionSet::GetRange2
          (VersionSet *this,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs1,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs2,
          InternalKey *smallest,InternalKey *largest)

{
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  local_58;
  const_iterator local_50;
  undefined1 local_48 [8];
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> all;
  InternalKey *largest_local;
  InternalKey *smallest_local;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs2_local;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs1_local;
  VersionSet *this_local;
  
  all.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)largest;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)local_48,
             inputs1);
  local_58._M_current =
       (FileMetaData **)
       std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::end
                 ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                  local_48);
  __gnu_cxx::
  __normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>
  ::__normal_iterator<leveldb::FileMetaData**>
            ((__normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>
              *)&local_50,&local_58);
  __first = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::begin
                      (inputs2);
  __last = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::end
                     (inputs2);
  std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
  insert<__gnu_cxx::__normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,void>
            ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)local_48,
             local_50,(__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                       )__first._M_current,
             (__normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
              )__last._M_current);
  GetRange(this,(vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                local_48,smallest,
           (InternalKey *)
           all.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)local_48);
  return;
}

Assistant:

void VersionSet::GetRange2(const std::vector<FileMetaData*>& inputs1,
                           const std::vector<FileMetaData*>& inputs2,
                           InternalKey* smallest, InternalKey* largest) {
  std::vector<FileMetaData*> all = inputs1;
  all.insert(all.end(), inputs2.begin(), inputs2.end());
  GetRange(all, smallest, largest);
}